

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_environment_evaluateSymbolBinding
          (sysbvm_context_t *context,sysbvm_tuple_t environment,sysbvm_tuple_t binding)

{
  ulong uVar1;
  bool bVar2;
  _Bool _Var3;
  sysbvm_tuple_t sVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  sysbvm_tuple_t foundBinding;
  sysbvm_tuple_t *local_28;
  
  uVar6 = environment & 0xf;
  if (uVar6 == 0 && environment != 0) {
    sVar4 = *(sysbvm_tuple_t *)environment;
  }
  else if ((int)uVar6 == 0xf) {
    sVar4 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,environment >> 4);
  }
  else {
    sVar4 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar6);
  }
  if (sVar4 != (context->roots).functionActivationEnvironmentType) goto LAB_0010c6c6;
  sVar4 = *(sysbvm_tuple_t *)(binding + 0x38);
  if ((sVar4 == *(sysbvm_tuple_t *)(environment + 0x80)) || (*(long *)(environment + 0x88) != 0)) {
    uVar6 = *(ulong *)(binding + 0x40);
    if (uVar6 == 0 || (uVar6 & 0xf) != 0) {
      lVar7 = (long)uVar6 >> 4;
    }
    else {
      lVar7 = *(long *)(uVar6 + 0x10);
    }
    uVar6 = binding & 0xf;
    if (uVar6 == 0 && binding != 0) {
      sVar4 = *(sysbvm_tuple_t *)binding;
    }
    else if ((int)uVar6 == 0xf) {
      sVar4 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,binding >> 4);
    }
    else {
      sVar4 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar6);
    }
    if (sVar4 == (context->roots).symbolArgumentBindingType) {
      uVar6 = *(ulong *)(environment + 0xa0);
LAB_0010c686:
      if (uVar6 == 0 || (uVar6 & 0xf) != 0) goto LAB_0010c6ba;
LAB_0010c6b3:
      sVar4 = *(sysbvm_tuple_t *)(uVar6 + 0x10 + lVar7 * 8);
    }
    else {
      if (sVar4 != (context->roots).symbolLocalBindingType) {
        if (sVar4 != (context->roots).symbolCaptureBindingType) {
          abort();
        }
        uVar6 = *(ulong *)(environment + 0x98);
        goto LAB_0010c686;
      }
      uVar1 = *(ulong *)(environment + 0x90);
      uVar6 = *(ulong *)(environment + 0xa0);
      if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
        lVar5 = (long)uVar1 >> 4;
      }
      else {
        lVar5 = *(long *)(uVar1 + 0x10);
      }
      if ((uVar6 & 0xf) == 0 && uVar6 != 0) {
        lVar7 = lVar7 + lVar5;
        goto LAB_0010c6b3;
      }
LAB_0010c6ba:
      sVar4 = 0;
    }
    bVar2 = false;
  }
  else {
    bVar2 = true;
  }
  if (!bVar2) {
    return sVar4;
  }
LAB_0010c6c6:
  local_28 = (sysbvm_tuple_t *)0x0;
  if ((binding & 0xf) == 0 && binding != 0) {
    sVar4 = *(sysbvm_tuple_t *)(binding + 0x10);
  }
  else {
    sVar4 = 0;
  }
  _Var3 = sysbvm_environment_lookSymbolRecursively
                    (context,environment,sVar4,(sysbvm_tuple_t *)&local_28);
  if (!_Var3) {
    sysbvm_error("Failed to evaluate analyzed symbol binding.");
  }
  if ((((ulong)local_28 & 0xf) != 0 || local_28 == (sysbvm_tuple_t *)0x0) ||
     (*local_28 != (context->roots).symbolValueBindingType)) {
    sysbvm_error("A value binding in the evaluation context is required.");
  }
  if ((((ulong)local_28 & 0xf) == 0 && local_28 != (sysbvm_tuple_t *)0x0) &&
     (0x57 < *(uint *)((long)local_28 + 0xc))) {
    sVar4 = local_28[7];
  }
  else {
    sVar4 = 0;
  }
  return sVar4;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_environment_evaluateSymbolBinding(sysbvm_context_t *context, sysbvm_tuple_t environment, sysbvm_tuple_t binding)
{
    if(sysbvm_tuple_getType(context, environment) == context->roots.functionActivationEnvironmentType)
    {
        sysbvm_functionActivationEnvironment_t *activationEnvironment = (sysbvm_functionActivationEnvironment_t*)environment;
        sysbvm_symbolAnalysisBinding_t *analysisBinding = (sysbvm_symbolAnalysisBinding_t*)binding;
        if(analysisBinding->ownerFunction == activationEnvironment->functionDefinition || activationEnvironment->dependentFunctionType)
        {
            size_t vectorIndex = sysbvm_tuple_size_decode(analysisBinding->vectorIndex);
            sysbvm_tuple_t bindingType = sysbvm_tuple_getType(context, binding);
            if(bindingType == context->roots.symbolArgumentBindingType)
                return sysbvm_array_at(activationEnvironment->valueVector, vectorIndex);
            else if(bindingType == context->roots.symbolLocalBindingType)
                return sysbvm_array_at(activationEnvironment->valueVector, sysbvm_tuple_size_decode(activationEnvironment->argumentVectorSize) + vectorIndex);
            else if(bindingType == context->roots.symbolCaptureBindingType)
                return sysbvm_array_at(activationEnvironment->captureVector, vectorIndex);
            abort();
        }
    }

    sysbvm_tuple_t foundBinding = SYSBVM_NULL_TUPLE;
    if(!sysbvm_environment_lookSymbolRecursively(context, environment, sysbvm_symbolBinding_getName(binding), &foundBinding))
        sysbvm_error("Failed to evaluate analyzed symbol binding.");

    if(!sysbvm_symbolBinding_isValueQuick(context, foundBinding))
        sysbvm_error("A value binding in the evaluation context is required.");

    return sysbvm_symbolValueBinding_getValue(foundBinding);
}